

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParallelContext.cpp
# Opt level: O1

void __thiscall amrex::ParallelContext::Frame::Frame(Frame *this,MPI_Comm c,int id,int io_rank)

{
  this->comm = c;
  this->group = 0;
  this->m_id = id;
  this->m_rank_me = -1;
  this->m_nranks = 0;
  this->m_mpi_tag = ParallelDescriptor::m_MinTag;
  this->m_io_rank = io_rank;
  (this->m_out_filename)._M_dataplus._M_p = (pointer)&(this->m_out_filename).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_out_filename,"");
  (this->m_out)._M_t.
  super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_ofstream<char,_std::char_traits<char>_> *)0x0;
  this->m_rank_me = 0;
  this->m_nranks = 1;
  return;
}

Assistant:

Frame::Frame (MPI_Comm c, int id, int io_rank)
    : comm(c),
      m_id(id),
      m_mpi_tag(ParallelDescriptor::MinTag()),
      m_io_rank(io_rank),
      m_out_filename(""),
      m_out(nullptr)
{
#ifdef BL_USE_MPI
    MPI_Comm_group(comm, &group);
    MPI_Comm_rank(comm, &m_rank_me);
    MPI_Comm_size(comm, &m_nranks);
#else
    m_rank_me = 0;
    m_nranks = 1;
#endif
}